

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t ctrl_get_quantizer(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  aom_codec_err_t aVar4;
  long *plVar5;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar5 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar5 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar5 + 1;
  }
  piVar2 = (int *)*plVar5;
  if (piVar2 == (int *)0x0) {
    aVar4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar3 = av1_get_quantizer(ctx->ppi->cpi);
    *piVar2 = iVar3;
    aVar4 = AOM_CODEC_OK;
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t ctrl_get_quantizer(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  int *const arg = va_arg(args, int *);
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  *arg = av1_get_quantizer(ctx->ppi->cpi);
  return AOM_CODEC_OK;
}